

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O3

RayDifferential * __thiscall
pbrt::SurfaceInteraction::SpawnRay
          (RayDifferential *__return_storage_ptr__,SurfaceInteraction *this,RayDifferential *rayi,
          BSDF *bsdf,Vector3f *wi,BxDFFlags flags)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined4 uVar19;
  undefined4 uVar20;
  ulong uVar16;
  ulong uVar17;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined8 uVar18;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined1 auVar30 [16];
  Point3fi *pPVar31;
  Point3fi *pPVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  float fVar53;
  float fVar54;
  undefined1 auVar51 [16];
  float fVar55;
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  float fVar57;
  undefined1 auVar58 [16];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  
  Interaction::SpawnRay(__return_storage_ptr__,&this->super_Interaction,wi);
  if (rayi->hasDifferentials == true) {
    auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    fVar1 = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x;
    fVar2 = this->dvdy;
    uVar14._0_4_ = this->dudx;
    uVar14._4_4_ = this->dvdx;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar14;
    fVar59 = (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar15._0_4_ = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y;
    uVar15._4_4_ = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar15;
    fVar49 = this->dudy;
    uVar3 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar19 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar40._4_4_ = uVar19;
    auVar40._0_4_ = uVar3;
    auVar40._8_8_ = 0;
    uVar4 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
    uVar20 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar48._4_4_ = uVar20;
    auVar48._0_4_ = uVar4;
    auVar48._8_8_ = 0;
    uVar16._0_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar16._4_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar16;
    fVar50 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar42 = ZEXT416((uint)fVar50);
    auVar34 = vxorps_avx512vl(ZEXT416((uint)(rayi->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x
                                     ),auVar33);
    uVar17._0_4_ = (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y;
    uVar17._4_4_ = (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar17;
    fVar53 = fVar2 * fVar1 + fVar59 * fVar49;
    auVar35 = vpermi2ps_avx512vl(_DAT_004a9df0,auVar39,ZEXT416((uint)fVar1));
    auVar38 = vshufps_avx(auVar36,auVar36,0xe1);
    auVar36 = vxorps_avx512vl(ZEXT416((uint)(rayi->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z
                                     ),auVar33);
    fVar1 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar37 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar43,ZEXT416((uint)fVar59));
    auVar39 = vmovshdup_avx(auVar39);
    auVar43 = vmovshdup_avx(auVar48);
    auVar56._0_4_ = auVar35._0_4_ * auVar38._0_4_ + (float)(undefined4)uVar14 * auVar37._0_4_;
    auVar56._4_4_ = auVar35._4_4_ * auVar38._4_4_ + (float)uVar14._4_4_ * auVar37._4_4_;
    auVar56._8_4_ = auVar35._8_4_ * auVar38._8_4_ + auVar37._8_4_ * 0.0;
    auVar56._12_4_ = auVar35._12_4_ * auVar38._12_4_ + auVar37._12_4_ * 0.0;
    uVar5 = (rayi->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar21 = (rayi->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar35._4_4_ = uVar21;
    auVar35._0_4_ = uVar5;
    auVar35._8_8_ = 0;
    auVar38 = vxorps_avx512vl(auVar35,auVar33);
    auVar35 = vsubps_avx(auVar38,auVar40);
    auVar38._0_4_ = (float)(undefined4)uVar14 * (float)(undefined4)uVar15;
    auVar38._4_4_ = (float)uVar14._4_4_ * (float)uVar15._4_4_;
    auVar38._8_8_ = 0;
    auVar44._0_4_ = (float)(undefined4)uVar15 * fVar2 + (float)(undefined4)uVar17 * fVar49;
    auVar44._4_4_ = (float)uVar15._4_4_ * fVar2 + (float)uVar17._4_4_ * fVar49;
    auVar44._8_4_ = fVar2 * 0.0 + fVar49 * 0.0;
    auVar44._12_4_ = fVar2 * 0.0 + fVar49 * 0.0;
    uVar6 = (rayi->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar22 = (rayi->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar37._4_4_ = uVar22;
    auVar37._0_4_ = uVar6;
    auVar37._8_8_ = 0;
    fVar54 = auVar43._0_4_;
    fVar59 = auVar36._0_4_ - fVar54;
    fVar49 = auVar34._0_4_ - fVar1;
    auVar38 = vmovshdup_avx(auVar38);
    fVar2 = (float)(undefined4)uVar14 * auVar39._0_4_ + auVar38._0_4_;
    auVar39 = vxorps_avx512vl(auVar37,auVar33);
    auVar39 = vsubps_avx(auVar39,auVar48);
    auVar38 = ZEXT416((uint)fVar50);
    auVar33 = ZEXT416((uint)fVar2);
    auVar34 = ZEXT416((uint)fVar49);
    if (flags == SpecularTransmission) {
      __return_storage_ptr__->hasDifferentials = true;
      pPVar31 = &(this->super_Interaction).pi;
      pPVar32 = &(this->super_Interaction).pi;
      auVar41._0_4_ =
           (pPVar31->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
      auVar41._4_4_ =
           (pPVar31->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar41._8_4_ =
           (pPVar32->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      auVar41._12_4_ =
           (pPVar32->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      uVar18 = *(undefined8 *)
                &(this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar36 = vinsertps_avx(auVar41,ZEXT416((uint)(this->super_Interaction).pi.
                                                    super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.high),0x10);
      fVar57 = ((this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
               (this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
      auVar37 = vaddss_avx512f(ZEXT416((uint)fVar57),
                               ZEXT416((uint)(this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z));
      auVar58._0_4_ = (float)uVar18 + auVar36._0_4_;
      auVar58._4_4_ = (float)((ulong)uVar18 >> 0x20) + auVar36._4_4_;
      auVar58._8_4_ = auVar36._8_4_ + 0.0;
      auVar58._12_4_ = auVar36._12_4_ + 0.0;
      auVar45._8_4_ = 0x3f000000;
      auVar45._0_8_ = 0x3f0000003f000000;
      auVar45._12_4_ = 0x3f000000;
      auVar36 = vmulps_avx512vl(auVar58,auVar45);
      uVar11 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar27 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar67._0_4_ = auVar36._0_4_ + (float)uVar11;
      auVar67._4_4_ = auVar36._4_4_ + (float)uVar27;
      auVar67._8_4_ = auVar36._8_4_ + 0.0;
      auVar67._12_4_ = auVar36._12_4_ + 0.0;
      uVar18 = vmovlps_avx(auVar67);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar18;
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar18 >> 0x20);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = auVar37._0_4_;
      uVar12 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar28 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
      fVar55 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar63._0_4_ = auVar36._0_4_ + (float)uVar12;
      auVar63._4_4_ = auVar36._4_4_ + (float)uVar28;
      auVar63._8_4_ = auVar36._8_4_ + 0.0;
      auVar63._12_4_ = auVar36._12_4_ + 0.0;
      uVar18 = vmovlps_avx(auVar63);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar18;
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar18 >> 0x20);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = fVar57 + fVar55;
      auVar36 = vmovshdup_avx(auVar51);
      auVar64._0_4_ = 1.0 / bsdf->eta;
      auVar64._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar40 = vfmadd213ss_avx512f(auVar48,auVar36,ZEXT416((uint)(fVar54 * fVar50)));
      auVar37 = vfmsub231ss_fma(ZEXT416((uint)(fVar54 * fVar50)),auVar38,auVar43);
      auVar38 = vblendps_avx(auVar36,auVar44,2);
      auVar36 = vaddss_avx512f(auVar40,auVar37);
      vxorps_avx512vl(auVar40,auVar40);
      auVar58 = ZEXT416((uint)fVar1);
      auVar40 = vfmadd231ss_fma(auVar36,auVar58,auVar51);
      vucomiss_avx512f(auVar40);
      auVar36 = vinsertps_avx(ZEXT416((uint)fVar53),auVar44,0x1c);
      auVar37 = vmovshdup_avx512vl(auVar35);
      auVar44 = vmulss_avx512f(auVar43,auVar33);
      auVar41 = vmulss_avx512f(auVar37,auVar64);
      auVar45 = vfmadd213ss_avx512f(auVar37,auVar38,ZEXT416((uint)(fVar59 * fVar50)));
      auVar37 = vfmsub231ss_fma(ZEXT416((uint)(fVar59 * fVar50)),auVar42,ZEXT416((uint)fVar59));
      auVar45 = vaddss_avx512f(auVar45,auVar37);
      auVar37 = vmovshdup_avx(auVar56);
      auVar46 = vfmadd213ss_avx512f(auVar48,auVar37,auVar44);
      auVar33 = vfmsub231ss_avx512f(auVar44,auVar33,auVar43);
      auVar44 = vfmadd231ss_avx512f(auVar45,auVar51,auVar35);
      auVar33 = vaddss_avx512f(auVar46,auVar33);
      auVar33 = vfmadd231ss_avx512f(auVar33,auVar56,auVar58);
      auVar44 = vaddss_avx512f(auVar33,auVar44);
      auVar33 = vmovshdup_avx512vl(auVar39);
      auVar45 = vmulss_avx512f(auVar33,auVar42);
      auVar46 = vfmadd213ss_avx512f(auVar39,auVar38,auVar45);
      auVar33 = vfmsub213ss_avx512f(auVar33,auVar42,auVar45);
      auVar45 = vmovshdup_avx512vl(auVar36);
      auVar33 = vaddss_avx512f(auVar46,auVar33);
      auVar46 = vmovshdup_avx512vl(auVar38);
      auVar47 = vmulss_avx512f(auVar43,auVar46);
      auVar33 = vfmadd231ss_avx512f(auVar33,auVar51,auVar34);
      auVar43 = vfmsub213ss_avx512f(auVar46,auVar43,auVar47);
      auVar34 = vfmadd213ss_avx512f(auVar45,auVar48,auVar47);
      auVar43 = vaddss_avx512f(auVar34,auVar43);
      auVar43 = vfmadd231ss_fma(auVar43,auVar36,auVar58);
      fVar1 = (wi->super_Tuple3<pbrt::Vector3,_float>).x;
      auVar34 = vaddss_avx512f(auVar43,auVar33);
      auVar48 = vsubss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)(auVar64._0_4_ * auVar35._0_4_)));
      auVar46._0_4_ = auVar64._0_4_ * auVar39._0_4_;
      auVar46._4_4_ = auVar64._0_4_ * auVar39._4_4_;
      auVar46._8_4_ = auVar64._0_4_ * auVar39._8_4_;
      auVar46._12_4_ = auVar64._0_4_ * auVar39._12_4_;
      uVar13 = (wi->super_Tuple3<pbrt::Vector3,_float>).y;
      uVar29 = (wi->super_Tuple3<pbrt::Vector3,_float>).z;
      auVar47._4_4_ = uVar29;
      auVar47._0_4_ = uVar13;
      auVar47._8_8_ = 0;
      auVar45 = vmovshdup_avx512vl(auVar47);
      auVar41 = vsubss_avx512f(auVar47,auVar41);
      auVar35 = vsubps_avx(auVar47,auVar46);
      auVar39 = vmulss_avx512f(auVar42,auVar45);
      auVar43 = vfmadd213ss_avx512f(auVar47,auVar38,auVar39);
      auVar39 = vfmsub231ss_avx512f(auVar39,auVar42,auVar45);
      auVar39 = vaddss_avx512f(auVar43,auVar39);
      auVar39 = vfmadd231ss_fma(auVar39,auVar51,ZEXT416((uint)fVar1));
      auVar33._8_4_ = 0x7fffffff;
      auVar33._0_8_ = 0x7fffffff7fffffff;
      auVar33._12_4_ = 0x7fffffff;
      auVar39 = vandps_avx512vl(auVar39,auVar33);
      auVar43 = vfmsub213ss_fma(auVar40,auVar64,auVar39);
      fVar54 = auVar43._0_4_;
      fVar53 = auVar64._0_4_ - (auVar64._0_4_ * auVar64._0_4_ * auVar40._0_4_) / auVar39._0_4_;
      auVar39 = vmulss_avx512f(auVar44,ZEXT416((uint)fVar53));
      fVar53 = auVar34._0_4_ * fVar53;
      auVar33 = vsubss_avx512f(auVar45,ZEXT416((uint)(fVar59 * auVar64._0_4_)));
      fVar59 = auVar39._0_4_;
      auVar39 = vaddss_avx512f(auVar48,ZEXT416((uint)(fVar59 * (float)(undefined4)uVar16 +
                                                     fVar54 * auVar56._0_4_)));
      auVar34 = vaddss_avx512f(auVar41,ZEXT416((uint)(auVar37._0_4_ * fVar54 +
                                                     auVar38._0_4_ * fVar59)));
      auVar39 = vinsertps_avx(auVar39,auVar34,0x10);
      uVar18 = vmovlps_avx(auVar39);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)uVar18;
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar18 >> 0x20);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z =
           auVar33._0_4_ + fVar59 * fVar50 + fVar54 * fVar2;
      fVar1 = (fVar1 - fVar49 * auVar64._0_4_) +
              auVar36._0_4_ * fVar54 + (float)(undefined4)uVar16 * fVar53;
      auVar39 = vinsertps_avx(ZEXT416((uint)fVar53),auVar43,0x10);
      auVar43 = vshufps_avx(auVar39,auVar39,0xe1);
      auVar33 = vpermi2ps_avx512vl(_DAT_028c1440,auVar36,auVar42);
      auVar34._0_4_ = auVar35._0_4_ + auVar38._0_4_ * auVar39._0_4_ + auVar33._0_4_ * auVar43._0_4_;
      auVar34._4_4_ = auVar35._4_4_ + auVar38._4_4_ * auVar39._4_4_ + auVar33._4_4_ * auVar43._4_4_;
      auVar34._8_4_ = auVar35._8_4_ + auVar38._8_4_ * auVar39._8_4_ + auVar33._8_4_ * auVar43._8_4_;
      auVar34._12_4_ =
           auVar35._12_4_ + auVar38._12_4_ * auVar39._12_4_ + auVar33._12_4_ * auVar43._12_4_;
    }
    else {
      if (flags != SpecularReflection) goto LAB_0035a946;
      __return_storage_ptr__->hasDifferentials = true;
      pPVar31 = &(this->super_Interaction).pi;
      pPVar32 = &(this->super_Interaction).pi;
      auVar42._0_4_ =
           (pPVar31->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
      auVar42._4_4_ =
           (pPVar31->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar42._8_4_ =
           (pPVar32->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      auVar42._12_4_ =
           (pPVar32->super_Point3<pbrt::Interval<float>_>).
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      uVar18 = *(undefined8 *)
                &(this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar36 = vinsertps_avx(auVar42,ZEXT416((uint)(this->super_Interaction).pi.
                                                    super_Point3<pbrt::Interval<float>_>.
                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.high),0x10);
      fVar55 = ((this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
               (this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
      auVar37 = vaddss_avx512f(ZEXT416((uint)fVar55),
                               ZEXT416((uint)(this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z));
      auVar61._0_4_ = (float)uVar18 + auVar36._0_4_;
      auVar61._4_4_ = (float)((ulong)uVar18 >> 0x20) + auVar36._4_4_;
      auVar61._8_4_ = auVar36._8_4_ + 0.0;
      auVar61._12_4_ = auVar36._12_4_ + 0.0;
      auVar30._8_4_ = 0x3f000000;
      auVar30._0_8_ = 0x3f0000003f000000;
      auVar30._12_4_ = 0x3f000000;
      auVar36 = vmulps_avx512vl(auVar61,auVar30);
      uVar7 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar23 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar66._0_4_ = auVar36._0_4_ + (float)uVar7;
      auVar66._4_4_ = auVar36._4_4_ + (float)uVar23;
      auVar66._8_4_ = auVar36._8_4_ + 0.0;
      auVar66._12_4_ = auVar36._12_4_ + 0.0;
      uVar18 = vmovlps_avx(auVar66);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar18;
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar18 >> 0x20);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = auVar37._0_4_;
      auVar40 = vmovshdup_avx512vl(auVar56);
      uVar8 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar24 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
      fVar49 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar62._0_4_ = auVar36._0_4_ + (float)uVar8;
      auVar62._4_4_ = auVar36._4_4_ + (float)uVar24;
      auVar62._8_4_ = auVar36._8_4_ + 0.0;
      auVar62._12_4_ = auVar36._12_4_ + 0.0;
      auVar36 = vmovshdup_avx(auVar35);
      uVar18 = vmovlps_avx(auVar62);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar18;
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar18 >> 0x20);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = fVar55 + fVar49;
      auVar37 = vmovshdup_avx(auVar51);
      auVar36 = vfmadd213ss_fma(auVar36,auVar37,ZEXT416((uint)(fVar59 * fVar50)));
      auVar42 = vfmsub231ss_fma(ZEXT416((uint)(fVar59 * fVar50)),auVar38,ZEXT416((uint)fVar59));
      auVar41 = vfmadd213ss_avx512f(auVar40,auVar48,ZEXT416((uint)(fVar54 * fVar2)));
      auVar40 = vfmsub231ss_fma(ZEXT416((uint)(fVar54 * fVar2)),auVar33,auVar43);
      auVar33 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ + auVar42._0_4_)),auVar51,auVar35);
      auVar36 = vaddss_avx512f(auVar41,auVar40);
      auVar45 = ZEXT416((uint)fVar1);
      auVar36 = vfmadd231ss_fma(auVar36,auVar56,auVar45);
      fVar1 = auVar36._0_4_ + auVar33._0_4_;
      auVar33 = vmovshdup_avx(auVar39);
      auVar36 = vmulss_avx512f(auVar38,auVar33);
      auVar42 = vfmadd213ss_avx512f(auVar39,auVar37,auVar36);
      auVar33 = vfmsub213ss_avx512f(auVar33,auVar38,auVar36);
      auVar36 = vmovshdup_avx512vl(auVar44);
      auVar40 = vmulss_avx512f(auVar36,auVar43);
      auVar41 = vfmadd213ss_avx512f(auVar48,auVar44,auVar40);
      auVar36 = vfmsub213ss_avx512f(auVar36,auVar43,auVar40);
      auVar33 = vaddss_avx512f(auVar42,auVar33);
      auVar33 = vfmadd231ss_fma(auVar33,auVar51,auVar34);
      auVar36 = vaddss_avx512f(auVar41,auVar36);
      auVar42 = vmulss_avx512f(auVar38,auVar43);
      auVar40 = vfmadd213ss_avx512f(auVar48,auVar37,auVar42);
      auVar43 = vfmsub231ss_avx512f(auVar42,auVar38,auVar43);
      auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)fVar53),auVar45);
      auVar43 = vaddss_avx512f(auVar40,auVar43);
      auVar36 = vaddss_avx512f(auVar36,auVar33);
      auVar33 = vfmadd231ss_fma(auVar43,auVar51,auVar45);
      fVar65 = auVar36._0_4_;
      auVar43 = vinsertps_avx(auVar37,auVar38,0x10);
      fVar57 = auVar33._0_4_;
      fVar2 = fVar2 * fVar57 + fVar1 * fVar50;
      auVar38 = vsubss_avx512f(ZEXT416((uint)(wi->super_Tuple3<pbrt::Vector3,_float>).x),auVar34);
      uVar9 = (wi->super_Tuple3<pbrt::Vector3,_float>).y;
      uVar25 = (wi->super_Tuple3<pbrt::Vector3,_float>).z;
      auVar68._4_4_ = uVar25;
      auVar68._0_4_ = uVar9;
      fVar49 = fVar53 * fVar57 + fVar65 * (float)(undefined4)uVar16;
      fVar50 = auVar56._0_4_ * fVar57 + fVar1 * (float)(undefined4)uVar16;
      fVar53 = auVar56._4_4_ * fVar57 + fVar1 * (float)uVar16._4_4_;
      fVar54 = auVar56._8_4_ * fVar57 + fVar1 * 0.0;
      fVar55 = auVar56._12_4_ * fVar57 + fVar1 * 0.0;
      auVar68._8_8_ = 0;
      auVar33 = vmovshdup_avx512vl(auVar68);
      fVar1 = fVar49 + fVar49 + auVar38._0_4_;
      uVar10 = (wi->super_Tuple3<pbrt::Vector3,_float>).x;
      uVar26 = (wi->super_Tuple3<pbrt::Vector3,_float>).y;
      auVar60._4_4_ = uVar26;
      auVar60._0_4_ = uVar10;
      auVar60._8_8_ = 0;
      auVar38 = vsubps_avx(auVar60,auVar35);
      auVar52._0_4_ = fVar50 + fVar50 + auVar38._0_4_;
      auVar52._4_4_ = fVar53 + fVar53 + auVar38._4_4_;
      auVar52._8_4_ = fVar54 + fVar54 + auVar38._8_4_;
      auVar52._12_4_ = fVar55 + fVar55 + auVar38._12_4_;
      fVar49 = auVar44._0_4_ * fVar57 + auVar43._0_4_ * fVar65;
      fVar50 = auVar44._4_4_ * fVar57 + auVar43._4_4_ * fVar65;
      fVar53 = auVar44._8_4_ * fVar57 + auVar43._8_4_ * fVar65;
      fVar54 = auVar44._12_4_ * fVar57 + auVar43._12_4_ * fVar65;
      uVar18 = vmovlps_avx(auVar52);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)uVar18;
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar18 >> 0x20);
      auVar39 = vsubps_avx512vl(auVar68,auVar39);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z =
           (auVar33._0_4_ - fVar59) + fVar2 + fVar2;
      auVar34._0_4_ = fVar49 + fVar49 + auVar39._0_4_;
      auVar34._4_4_ = fVar50 + fVar50 + auVar39._4_4_;
      auVar34._8_4_ = fVar53 + fVar53 + auVar39._8_4_;
      auVar34._12_4_ = fVar54 + fVar54 + auVar39._12_4_;
    }
    auVar39 = vunpcklps_avx(ZEXT416((uint)fVar1),auVar34);
    uVar18 = vmovlps_avx(auVar39);
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar18;
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)uVar18 >> 0x20);
    fVar1 = (float)vextractps_avx(auVar34,1);
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = fVar1;
  }
LAB_0035a946:
  fVar1 = (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar39 = ZEXT416((uint)(__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x
                   );
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar39,auVar39);
  auVar43 = ZEXT416((uint)(__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z
                   );
  auVar39 = vfmadd213ss_fma(auVar43,auVar43,auVar39);
  if (auVar39._0_4_ <= 1e+16) {
    fVar1 = (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar39 = ZEXT416((uint)(__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>
                            .x);
    auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar39,auVar39);
    auVar43 = ZEXT416((uint)(__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>
                            .z);
    auVar39 = vfmadd213ss_fma(auVar43,auVar43,auVar39);
    if (auVar39._0_4_ <= 1e+16) {
      fVar1 = (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
      auVar39 = ZEXT416((uint)(__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x
                       );
      auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar39,auVar39);
      auVar43 = ZEXT416((uint)(__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z
                       );
      auVar39 = vfmadd231ss_fma(auVar39,auVar43,auVar43);
      if (auVar39._0_4_ <= 1e+16) {
        fVar1 = (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y;
        auVar39 = ZEXT416((uint)(__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>
                                .x);
        auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar39,auVar39);
        auVar43 = ZEXT416((uint)(__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>
                                .z);
        auVar39 = vfmadd231ss_fma(auVar39,auVar43,auVar43);
        if (auVar39._0_4_ <= 1e+16) {
          return __return_storage_ptr__;
        }
      }
    }
  }
  __return_storage_ptr__->hasDifferentials = false;
  return __return_storage_ptr__;
}

Assistant:

RayDifferential SurfaceInteraction::SpawnRay(const RayDifferential &rayi,
                                             const BSDF &bsdf, const Vector3f &wi,
                                             BxDFFlags flags) const {
    RayDifferential rd(SpawnRay(wi));
    if (rayi.hasDifferentials) {
        // Compute ray differentials for specular reflection or transmission
        // Compute common factors for specular ray differentials
        Normal3f ns = shading.n;
        Normal3f dndx = shading.dndu * dudx + shading.dndv * dvdx;
        Normal3f dndy = shading.dndu * dudy + shading.dndv * dvdy;
        Vector3f dwodx = -rayi.rxDirection - wo, dwody = -rayi.ryDirection - wo;

        if (flags == (BxDFFlags::Reflection | BxDFFlags::Specular)) {
            // Initialize origins of specular differential rays
            rd.hasDifferentials = true;
            rd.rxOrigin = p() + dpdx;
            rd.ryOrigin = p() + dpdy;

            // Compute differential reflected directions
            Float dDNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dDNdy = Dot(dwody, ns) + Dot(wo, dndy);
            rd.rxDirection = wi - dwodx + 2.f * Vector3f(Dot(wo, ns) * dndx + dDNdx * ns);
            rd.ryDirection = wi - dwody + 2.f * Vector3f(Dot(wo, ns) * dndy + dDNdy * ns);

        } else if (flags == (BxDFFlags::Transmission | BxDFFlags::Specular)) {
            // Initialize origins of specular differential rays
            rd.hasDifferentials = true;
            rd.rxOrigin = p() + dpdx;
            rd.ryOrigin = p() + dpdy;

            // Compute differential transmitted directions
            // NOTE: eta coming in is now 1/eta from the derivation below, so
            // there's a 1/ here now...
            Float eta = 1 / bsdf.eta;
            if (Dot(wo, ns) < 0) {
                ns = -ns;
                dndx = -dndx;
                dndy = -dndy;
            }
            Float dDNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dDNdy = Dot(dwody, ns) + Dot(wo, dndy);
            // Compute partial derivatives of $\mu$
            Float mu = eta * Dot(wo, ns) - AbsDot(wi, ns);
            Float dmudx = (eta - (eta * eta * Dot(wo, ns)) / AbsDot(wi, ns)) * dDNdx;
            Float dmudy = (eta - (eta * eta * Dot(wo, ns)) / AbsDot(wi, ns)) * dDNdy;

            rd.rxDirection = wi - eta * dwodx + Vector3f(mu * dndx + dmudx * ns);
            rd.ryDirection = wi - eta * dwody + Vector3f(mu * dndy + dmudy * ns);
        }
    }
    // Squash potentially troublesome differentials
    // After many specuar bounces (e.g. the Transparent Machines scenes),
    // differentials can drift off to have large magnitudes, which ends up
    // leaving a trail of Infs and NaNs in their wake. We'll disable the
    // differentials when this seems to be happening.
    //
    // TODO: this is unsatisfying and would be nice to address in a more
    // principled way.
    if (LengthSquared(rd.rxDirection) > 1e16f || LengthSquared(rd.ryDirection) > 1e16f ||
        LengthSquared(Vector3f(rd.rxOrigin)) > 1e16f ||
        LengthSquared(Vector3f(rd.ryOrigin)) > 1e16f)
        rd.hasDifferentials = false;

    return rd;
}